

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC3TL1SLDropTL2EnhTest
          (DatarateTestSVC *this)

{
  bool bVar1;
  uint uVar2;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var3;
  ostream *this_00;
  ostream *poVar4;
  ostream *lhs_expression;
  DatarateTestSVC *in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int i;
  int n;
  int bitrate_array [2];
  I420VideoSource video;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe04;
  double *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  int iVar7;
  char *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  Type TVar8;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe48;
  Message *in_stack_fffffffffffffe78;
  AssertHelper *in_stack_fffffffffffffe80;
  AssertionResult local_170 [2];
  int local_14c;
  AssertionResult local_148 [2];
  double local_128;
  AssertionResult local_120 [2];
  double local_100;
  AssertionResult local_f8;
  int local_e4;
  uint local_cc;
  HasNewFatalFailureHelper local_c8;
  uint local_b0;
  int local_ac;
  uint local_a8 [7];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x3f;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",&local_89);
  uVar6 = 300;
  uVar5 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (uint)((ulong)in_stack_fffffffffffffe20 >> 0x20),(uint)in_stack_fffffffffffffe20,
             (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(int)in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe40,in_stack_fffffffffffffe48);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_a8[0] = 200;
  local_a8[1] = 0x226;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var3 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7d7be9);
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate = local_a8[*p_Var3];
  (*(in_RDI->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])();
  in_RDI->drop_frames_ = 0x96;
  local_ac = 0;
  for (local_b0 = 0; (int)local_b0 < 300; local_b0 = local_b0 + 1) {
    if ((int)local_b0 % 2 != 0) {
      in_RDI->drop_frames_list_[local_ac] = local_b0;
      local_ac = local_ac + 1;
    }
  }
  in_RDI->number_temporal_layers_ = 3;
  in_RDI->target_layer_bitrate_[0] =
       ((in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate * 0x32) / 100;
  in_RDI->target_layer_bitrate_[1] =
       ((in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate * 0x46) / 100;
  in_RDI->target_layer_bitrate_[2] =
       (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  bVar1 = testing::internal::AlwaysTrue();
  TVar8 = (Type)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffe30)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(in_RDI->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&in_RDI->super_DatarateTest,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_c8);
    if (bVar1) {
      local_cc = 5;
    }
    else {
      local_cc = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe04,uVar6));
    TVar8 = (Type)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    if (local_cc == 0) {
      for (local_e4 = 0; local_e4 < in_RDI->number_temporal_layers_ * in_RDI->number_spatial_layers_
          ; local_e4 = local_e4 + 1) {
        local_100 = (double)in_RDI->target_layer_bitrate_[local_e4] * 0.6;
        testing::internal::CmpHelperGE<double,double>
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   (double *)CONCAT44(in_stack_fffffffffffffe04,uVar6));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe30);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffe04,uVar6),
                     (char (*) [61])CONCAT44(in_stack_fffffffffffffdfc,uVar5));
          testing::AssertionResult::failure_message((AssertionResult *)0x7d7fc5);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe30,
                     (Type)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                     (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),in_stack_fffffffffffffe10);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe04,uVar6));
          testing::Message::~Message((Message *)0x7d801f);
        }
        local_cc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7d80a6);
        if (local_cc != 0) goto LAB_007d85c9;
        local_128 = (double)in_RDI->target_layer_bitrate_[local_e4] * 1.6;
        testing::internal::CmpHelperLE<double,double>
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   (double *)CONCAT44(in_stack_fffffffffffffe04,uVar6));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe30);
          testing::Message::operator<<
                    ((Message *)CONCAT44(in_stack_fffffffffffffe04,uVar6),
                     (char (*) [63])CONCAT44(in_stack_fffffffffffffdfc,uVar5));
          testing::AssertionResult::failure_message((AssertionResult *)0x7d8170);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe30,
                     (Type)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                     (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),in_stack_fffffffffffffe10);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe04,uVar6));
          testing::Message::~Message((Message *)0x7d81ca);
        }
        local_cc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7d824e);
        if (local_cc != 0) goto LAB_007d85c9;
      }
      this_00 = std::operator<<((ostream *)&std::cout,"          Decoded frames: ");
      uVar2 = GetDecodedFrames(in_RDI);
      poVar4 = (ostream *)std::ostream::operator<<(this_00,uVar2);
      std::operator<<(poVar4,"\n");
      TVar8 = (Type)((ulong)poVar4 >> 0x20);
      poVar4 = std::operator<<((ostream *)&std::cout,"          Mismatch frames: ");
      uVar2 = GetMismatchFrames(in_RDI);
      lhs_expression = (ostream *)std::ostream::operator<<(poVar4,uVar2);
      std::operator<<(lhs_expression,"\n");
      uVar2 = GetDecodedFrames(in_RDI);
      local_14c = 300 - uVar2;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((char *)lhs_expression,in_stack_fffffffffffffe10,(uint *)in_stack_fffffffffffffe08,
                 (uint *)CONCAT44(in_stack_fffffffffffffe04,uVar6));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
      if (!bVar1) {
        testing::Message::Message((Message *)this_00);
        in_stack_fffffffffffffe10 =
             testing::AssertionResult::failure_message((AssertionResult *)0x7d839c);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,TVar8,(char *)poVar4,(int)((ulong)lhs_expression >> 0x20)
                   ,in_stack_fffffffffffffe10);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe04,uVar6));
        testing::Message::~Message((Message *)0x7d83f9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x7d8467);
      GetMismatchFrames(in_RDI);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)lhs_expression,in_stack_fffffffffffffe10,(int *)in_stack_fffffffffffffe08,
                 (int *)CONCAT44(in_stack_fffffffffffffe04,uVar6));
      iVar7 = (int)((ulong)lhs_expression >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_170);
      if (!bVar1) {
        testing::Message::Message((Message *)this_00);
        testing::AssertionResult::failure_message((AssertionResult *)0x7d84f6);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,TVar8,(char *)poVar4,iVar7,in_stack_fffffffffffffe10);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe04,uVar6));
        testing::Message::~Message((Message *)0x7d8553);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x7d85be);
      local_cc = 0;
      goto LAB_007d85c9;
    }
    if (local_cc != 5) goto LAB_007d85c9;
  }
  iVar7 = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffe30);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe30,TVar8,in_stack_fffffffffffffe20,iVar7,
             in_stack_fffffffffffffe10);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe04,uVar6));
  testing::Message::~Message((Message *)0x7d7e99);
  local_cc = 1;
LAB_007d85c9:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x7d85d6);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC3TL1SLDropTL2EnhTest() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    // error_resilient for sequence can be off/0, since dropped frames (TL2)
    // are non-reference frames.
    cfg_.g_error_resilient = 0;

    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 300);
    const int bitrate_array[2] = { 200, 550 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    // Drop TL2: #frames(300) - (#TL0 + #TL1).
    drop_frames_ = 300 - 300 / 2;
    int n = 0;
    for (int i = 0; i < 300; i++) {
      if (i % 2 != 0) {
        drop_frames_list_[n] = i;
        n++;
      }
    }
    number_temporal_layers_ = 3;
    target_layer_bitrate_[0] = 50 * cfg_.rc_target_bitrate / 100;
    target_layer_bitrate_[1] = 70 * cfg_.rc_target_bitrate / 100;
    target_layer_bitrate_[2] = cfg_.rc_target_bitrate;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < number_temporal_layers_ * number_spatial_layers_; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.60)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.60)
          << " The datarate for the file is greater than target by too much!";
    }
#if CONFIG_AV1_DECODER
    // Test that no mismatches have been found.
    std::cout << "          Decoded frames: " << GetDecodedFrames() << "\n";
    std::cout << "          Mismatch frames: " << GetMismatchFrames() << "\n";
    EXPECT_EQ(300 - GetDecodedFrames(), drop_frames_);
    EXPECT_EQ((int)GetMismatchFrames(), 0);
#endif
  }